

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTDMT_releaseAllJobResources(ZSTDMT_CCtx *mtctx)

{
  long in_RDI;
  pthread_cond_t cond;
  pthread_mutex_t mutex;
  uint jobID;
  undefined1 auStackY_68 [24];
  ZSTDMT_bufferPool *in_stack_ffffffffffffffb0;
  buffer_t in_stack_ffffffffffffffb8;
  undefined1 local_38 [44];
  uint local_c;
  long local_8;
  
  local_8 = in_RDI;
  for (local_c = 0; local_c <= *(uint *)(local_8 + 0xbb0); local_c = local_c + 1) {
    memcpy(local_38,(void *)(*(long *)(local_8 + 8) + (ulong)local_c * 0x1b8 + 0x10),0x28);
    memcpy(auStackY_68,(void *)(*(long *)(local_8 + 8) + (ulong)local_c * 0x1b8 + 0x38),0x30);
    ZSTDMT_releaseBuffer(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
    memset((void *)(*(long *)(local_8 + 8) + (ulong)local_c * 0x1b8),0,0x1b8);
    memcpy((void *)(*(long *)(local_8 + 8) + (ulong)local_c * 0x1b8 + 0x10),local_38,0x28);
    memcpy((void *)(*(long *)(local_8 + 8) + (ulong)local_c * 0x1b8 + 0x38),auStackY_68,0x30);
  }
  *(void **)(local_8 + 0x120) = (void *)0x0;
  *(size_t *)(local_8 + 0x128) = 0;
  *(undefined8 *)(local_8 + 0x130) = 0;
  *(undefined4 *)(local_8 + 0xbc0) = 1;
  return;
}

Assistant:

static void ZSTDMT_releaseAllJobResources(ZSTDMT_CCtx* mtctx)
{
    unsigned jobID;
    DEBUGLOG(3, "ZSTDMT_releaseAllJobResources");
    for (jobID=0; jobID <= mtctx->jobIDMask; jobID++) {
        /* Copy the mutex/cond out */
        ZSTD_pthread_mutex_t const mutex = mtctx->jobs[jobID].job_mutex;
        ZSTD_pthread_cond_t const cond = mtctx->jobs[jobID].job_cond;

        DEBUGLOG(4, "job%02u: release dst address %08X", jobID, (U32)(size_t)mtctx->jobs[jobID].dstBuff.start);
        ZSTDMT_releaseBuffer(mtctx->bufPool, mtctx->jobs[jobID].dstBuff);

        /* Clear the job description, but keep the mutex/cond */
        ZSTD_memset(&mtctx->jobs[jobID], 0, sizeof(mtctx->jobs[jobID]));
        mtctx->jobs[jobID].job_mutex = mutex;
        mtctx->jobs[jobID].job_cond = cond;
    }
    mtctx->inBuff.buffer = g_nullBuffer;
    mtctx->inBuff.filled = 0;
    mtctx->allJobsCompleted = 1;
}